

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (action != 1) {
    return;
  }
  if (key != 0x100) {
    if (key == 0x108) {
      if ((swap_tear == 0) && (swap_interval < 1)) {
        return;
      }
      swap_interval = swap_interval + -1;
    }
    else {
      if (key != 0x109) {
        return;
      }
      swap_interval = swap_interval + 1;
    }
    glfwSwapInterval(swap_interval);
    update_window_title(window);
    return;
  }
  glfwSetWindowShouldClose(window,1);
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_UP:
        {
            if (swap_interval + 1 > swap_interval)
                set_swap_interval(window, swap_interval + 1);
            break;
        }

        case GLFW_KEY_DOWN:
        {
            if (swap_tear)
            {
                if (swap_interval - 1 < swap_interval)
                    set_swap_interval(window, swap_interval - 1);
            }
            else
            {
                if (swap_interval - 1 >= 0)
                    set_swap_interval(window, swap_interval - 1);
            }
            break;
        }

        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, 1);
            break;
    }
}